

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AllReader::loop(AllReader *this,uint64_t limit)

{
  long *plVar1;
  bool bVar2;
  WiderType<Decay<int>,_Decay<unsigned_long_&>_> size;
  Array<unsigned_char> *params;
  uchar *puVar3;
  size_t sVar4;
  size_t sVar5;
  ArrayPtr<unsigned_char> AVar6;
  uchar *puStack_a0;
  ArrayPtr<unsigned_char> partPtr;
  undefined1 local_88 [8];
  Array<unsigned_char> part;
  Fault local_60;
  Fault f;
  unsigned_long *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  uint64_t limit_local;
  AllReader *this_local;
  
  local_50 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long&>::operator>
            ((DebugComparison<unsigned_long_&,_int> *)local_48,
             (DebugExpression<unsigned_long&> *)&local_50,(int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xb6,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",
               (DebugComparison<unsigned_long_&,_int> *)local_48,
               (char (*) [26])"Reached limit before EOF.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  partPtr.size_._4_4_ = 0x1000;
  size = min<int,unsigned_long&>
                   ((int *)((long)&partPtr.size_ + 4),(unsigned_long *)&_kjCondition.result);
  heapArray<unsigned_char>((Array<unsigned_char> *)local_88,size);
  AVar6 = Array<unsigned_char>::asPtr((Array<unsigned_char> *)local_88);
  partPtr.ptr = (uchar *)AVar6.size_;
  puStack_a0 = AVar6.ptr;
  params = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_88);
  Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
            ((Vector<kj::Array<unsigned_char>> *)(limit + 8),params);
  plVar1 = *(long **)limit;
  puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&stack0xffffffffffffff60);
  sVar4 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&stack0xffffffffffffff60);
  sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&stack0xffffffffffffff60);
  (**(code **)(*plVar1 + 8))(&stack0xffffffffffffff58,plVar1,puVar3,sVar4,sVar5);
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::AllReader::loop(unsigned_long)::_lambda(unsigned_long)_1_>
            ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffff58);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffff58);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_88);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> loop(uint64_t limit) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");

    auto part = heapArray<byte>(kj::min(4096, limit));
    auto partPtr = part.asPtr();
    parts.add(kj::mv(part));
    return input.tryRead(partPtr.begin(), partPtr.size(), partPtr.size())
        .then([this,KJ_CPCAP(partPtr),limit](size_t amount) mutable -> Promise<uint64_t> {
      limit -= amount;
      if (amount < partPtr.size()) {
        return limit;
      } else {
        return loop(limit);
      }
    });
  }